

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSExporter::WriteColor(Discreet3DSExporter *this,aiColor3D *color)

{
  StreamWriterLE *writer;
  ChunkWriter chunk;
  
  writer = &this->writer;
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk,writer,0x10);
  StreamWriter<false,_false>::Put<float>(writer,color->r);
  StreamWriter<false,_false>::Put<float>(writer,color->g);
  StreamWriter<false,_false>::Put<float>(writer,color->b);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk);
  return;
}

Assistant:

void Discreet3DSExporter::WriteColor(const aiColor3D& color) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_RGBF);
    writer.PutF4(color.r);
    writer.PutF4(color.g);
    writer.PutF4(color.b);
}